

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpArrayLength
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  Instruction *this_00;
  DefUseManager *pDVar1;
  IRContext *this_01;
  bool bVar2;
  uint32_t local_8c;
  iterator local_88;
  undefined8 local_80;
  SmallVector<unsigned_int,_2UL> local_78;
  uint32_t local_4c;
  uint32_t local_48;
  uint32_t new_member_idx;
  uint32_t member_idx;
  uint32_t type_id;
  Instruction *pointer_type_inst;
  Instruction *pIStack_30;
  uint32_t pointer_type_id;
  Instruction *struct_inst;
  Instruction *pIStack_20;
  uint32_t struct_id;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  struct_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(inst,0);
  pDVar1 = Pass::get_def_use_mgr((Pass *)this);
  pIStack_30 = analysis::DefUseManager::GetDef(pDVar1,struct_inst._4_4_);
  pointer_type_inst._4_4_ = opt::Instruction::type_id(pIStack_30);
  pDVar1 = Pass::get_def_use_mgr((Pass *)this);
  _member_idx = analysis::DefUseManager::GetDef(pDVar1,pointer_type_inst._4_4_);
  new_member_idx = opt::Instruction::GetSingleWordInOperand(_member_idx,1);
  local_48 = opt::Instruction::GetSingleWordInOperand(pIStack_20,1);
  local_8c = GetNewMemberIndex(this,new_member_idx,local_48);
  this_00 = pIStack_20;
  local_4c = local_8c;
  if (local_8c == 0xffffffff) {
    __assert_fail("new_member_idx != kRemovedMember",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x2ae,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpArrayLength(Instruction *)"
                 );
  }
  bVar2 = local_48 != local_8c;
  if (bVar2) {
    local_88 = &local_8c;
    local_80 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_88;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_78,init_list);
    opt::Instruction::SetInOperand(this_00,1,&local_78);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_78);
    this_01 = Pass::context((Pass *)this);
    IRContext::UpdateDefUse(this_01,pIStack_20);
  }
  return bVar2;
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpArrayLength(Instruction* inst) {
  uint32_t struct_id = inst->GetSingleWordInOperand(0);
  Instruction* struct_inst = get_def_use_mgr()->GetDef(struct_id);
  uint32_t pointer_type_id = struct_inst->type_id();
  Instruction* pointer_type_inst = get_def_use_mgr()->GetDef(pointer_type_id);
  uint32_t type_id = pointer_type_inst->GetSingleWordInOperand(1);

  uint32_t member_idx = inst->GetSingleWordInOperand(1);
  uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
  assert(new_member_idx != kRemovedMember);

  if (member_idx == new_member_idx) {
    return false;
  }

  inst->SetInOperand(1, {new_member_idx});
  context()->UpdateDefUse(inst);
  return true;
}